

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

XmlWriter * __thiscall Catch::XmlWriter::operator=(XmlWriter *this,XmlWriter *other)

{
  undefined1 local_60 [8];
  XmlWriter temp;
  XmlWriter *other_local;
  XmlWriter *this_local;
  
  temp.m_os = (ostream *)other;
  XmlWriter((XmlWriter *)local_60,other);
  swap(this,(XmlWriter *)local_60);
  ~XmlWriter((XmlWriter *)local_60);
  return this;
}

Assistant:

XmlWriter& operator = ( XmlWriter const& other ) {
            XmlWriter temp( other );
            swap( temp );
            return *this;
        }